

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcPrePartialsStates
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1
          ,int *states2,double *matrices2,int startPattern,int endPattern)

{
  double *pdVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  
  lVar15 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  if (0 < lVar15) {
    iVar5 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
    lVar20 = 0;
    iVar16 = startPattern * 4;
    do {
      if (startPattern < endPattern) {
        auVar2 = *(undefined1 (*) [32])(matrices1 + lVar20 * 0x14);
        pdVar1 = matrices1 + lVar20 * 0x14 + 5;
        dVar11 = *pdVar1;
        dVar12 = pdVar1[1];
        dVar13 = pdVar1[2];
        dVar14 = pdVar1[3];
        auVar3 = *(undefined1 (*) [32])(matrices1 + lVar20 * 0x14 + 10);
        auVar4 = *(undefined1 (*) [32])(matrices1 + lVar20 * 0x14 + 0xf);
        lVar17 = 0;
        lVar19 = (long)endPattern - (long)startPattern;
        do {
          lVar18 = (long)*(int *)((long)states2 + lVar17 + (long)startPattern * 4) +
                   (long)((int)lVar20 * 0x14);
          dVar6 = partials1[(long)iVar16 + lVar17 + 1] * matrices2[lVar18 + 5];
          dVar7 = partials1[iVar16 + lVar17] * matrices2[lVar18];
          dVar8 = partials1[(long)iVar16 + lVar17 + 2] * matrices2[lVar18 + 10];
          dVar9 = partials1[(long)iVar16 + lVar17 + 3] * matrices2[lVar18 + 0xf];
          auVar21._8_8_ = dVar7;
          auVar21._0_8_ = dVar7;
          auVar21._16_8_ = dVar7;
          auVar21._24_8_ = dVar7;
          auVar23._0_8_ = dVar11 * dVar6;
          auVar23._8_8_ = dVar12 * dVar6;
          auVar23._16_8_ = dVar13 * dVar6;
          auVar23._24_8_ = dVar14 * dVar6;
          auVar10 = vfmadd213pd_fma(auVar21,auVar2,auVar23);
          auVar24._8_8_ = dVar8;
          auVar24._0_8_ = dVar8;
          auVar24._16_8_ = dVar8;
          auVar24._24_8_ = dVar8;
          auVar10 = vfmadd213pd_fma(auVar24,auVar3,ZEXT1632(auVar10));
          auVar22._8_8_ = dVar9;
          auVar22._0_8_ = dVar9;
          auVar22._16_8_ = dVar9;
          auVar22._24_8_ = dVar9;
          auVar10 = vfmadd213pd_fma(auVar22,auVar4,ZEXT1632(auVar10));
          *(undefined1 (*) [32])(destP + iVar16 + lVar17) = ZEXT1632(auVar10);
          lVar17 = lVar17 + 4;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      lVar20 = lVar20 + 1;
      iVar16 = iVar16 + iVar5 * 4;
    } while (lVar20 != lVar15);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const int* states2,
                                                                    const REALTYPE* matrices2,
                                                                    int startPattern,
                                                                    int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
            u += 4*startPattern;
        }
        int w = l*4*OFFSET;


        PREFETCH_MATRIX_TRANSPOSE(1, matrices1, w); //m100, m101, ..., m133
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1, partials1, u); // p10, p11, p12, p13

            const int state2 = states2[k];
            PREFETCH_MATRIX_COLUMN(2, matrices2, w + state2); // sum20, sum21, sum22, sum23

            DO_SCHUR_PRODUCT(1, 1, 2); // reWrites p10, p11, p12, p13

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13

            // Final results
            destP[u] = sum10;
            destP[u + 1] = sum11;
            destP[u + 2] = sum12;
            destP[u + 3] = sum13;

            u += 4;

        }
    }
}